

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotBarsH<unsigned_long_long>
               (char *label_id,unsigned_long_long *xs,unsigned_long_long *ys,int count,double height
               ,int offset,int stride)

{
  undefined1 local_58 [8];
  GetterXsYs<unsigned_long_long> getter;
  int stride_local;
  int offset_local;
  double height_local;
  int count_local;
  unsigned_long_long *ys_local;
  unsigned_long_long *xs_local;
  char *label_id_local;
  
  getter.Stride = stride;
  getter._28_4_ = offset;
  GetterXsYs<unsigned_long_long>::GetterXsYs
            ((GetterXsYs<unsigned_long_long> *)local_58,xs,ys,count,offset,stride);
  PlotBarsHEx<ImPlot::GetterXsYs<unsigned_long_long>,double>
            (label_id,(GetterXsYs<unsigned_long_long> *)local_58,height);
  return;
}

Assistant:

void PlotBarsH(const char* label_id, const T* xs, const T* ys, int count, double height, int offset, int stride) {
    GetterXsYs<T> getter(xs,ys,count,offset,stride);
    PlotBarsHEx(label_id, getter, height);
}